

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis_enc.c
# Opt level: O0

void SetSegmentAlphas(VP8Encoder *enc,int *centers,int mid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  int beta;
  int alpha;
  int n;
  int max;
  int min;
  int nb;
  int local_24;
  int local_20;
  int local_1c;
  
  iVar1 = *(int *)(in_RDI + 0x20);
  local_1c = *in_RSI;
  local_20 = *in_RSI;
  if (1 < iVar1) {
    for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
      if (in_RSI[local_24] < local_1c) {
        local_1c = in_RSI[local_24];
      }
      if (local_20 < in_RSI[local_24]) {
        local_20 = in_RSI[local_24];
      }
    }
  }
  if (local_20 == local_1c) {
    local_20 = local_1c + 1;
  }
  for (local_24 = 0; local_24 < iVar1; local_24 = local_24 + 1) {
    iVar3 = in_RSI[local_24];
    iVar2 = clip(((in_RSI[local_24] - in_EDX) * 0xff) / (local_20 - local_1c),-0x7f,0x7f);
    *(int *)(in_RDI + (long)local_24 * 0x2e8 + 0x500) = iVar2;
    iVar3 = clip(((iVar3 - local_1c) * 0xff) / (local_20 - local_1c),0,0xff);
    *(int *)(in_RDI + (long)local_24 * 0x2e8 + 0x504) = iVar3;
  }
  return;
}

Assistant:

static void SetSegmentAlphas(VP8Encoder* const enc,
                             const int centers[NUM_MB_SEGMENTS],
                             int mid) {
  const int nb = enc->segment_hdr_.num_segments_;
  int min = centers[0], max = centers[0];
  int n;

  if (nb > 1) {
    for (n = 0; n < nb; ++n) {
      if (min > centers[n]) min = centers[n];
      if (max < centers[n]) max = centers[n];
    }
  }
  if (max == min) max = min + 1;
  assert(mid <= max && mid >= min);
  for (n = 0; n < nb; ++n) {
    const int alpha = 255 * (centers[n] - mid) / (max - min);
    const int beta = 255 * (centers[n] - min) / (max - min);
    enc->dqm_[n].alpha_ = clip(alpha, -127, 127);
    enc->dqm_[n].beta_ = clip(beta, 0, 255);
  }
}